

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_CollapseIrredundantFull(Vec_Str_t *vSop,int nCubes,int nVars)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  uint *__ptr;
  void *pvVar5;
  ulong uVar6;
  sat_solver *s;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int local_7c;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < (nVars + nCubes) - 1U) {
    iVar3 = nVars + nCubes;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar4;
  pcVar9 = vSop->pArray;
  __ptr = (uint *)malloc(0x10);
  uVar7 = 8;
  if (6 < nCubes - 1U) {
    uVar7 = nCubes;
  }
  __ptr[1] = 0;
  *__ptr = uVar7;
  if (uVar7 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar7 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  uVar6 = (long)nVars + 3;
  if (vSop->nSize != (int)uVar6 * nCubes + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x11c,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
  }
  if (*pcVar9 != '\0') {
    lVar13 = (long)(int)__ptr[1];
    uVar7 = *__ptr;
    pvVar5 = *(void **)(__ptr + 2);
    do {
      if ((uint)lVar13 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (pvVar5 == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(pvVar5,0x80);
          }
          uVar7 = 0x10;
        }
        else {
          uVar11 = uVar7 * 2;
          if (SBORROW4(uVar7,uVar11) != 0 < (int)uVar7) {
            uVar7 = uVar11;
            if (pvVar5 == (void *)0x0) {
              pvVar5 = malloc((ulong)uVar11 << 3);
            }
            else {
              pvVar5 = realloc(pvVar5,(ulong)uVar11 << 3);
            }
          }
        }
      }
      *(char **)((long)pvVar5 + lVar13 * 8) = pcVar9;
      lVar13 = lVar13 + 1;
      pcVar1 = pcVar9 + uVar6;
      pcVar9 = pcVar9 + uVar6;
    } while (*pcVar1 != '\0');
    __ptr[1] = (uint)lVar13;
    *__ptr = uVar7;
    *(void **)(__ptr + 2) = pvVar5;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars + nCubes);
  uVar7 = __ptr[1];
  uVar8 = (ulong)(int)uVar7;
  if (0 < (long)uVar8) {
    lVar13 = *(long *)(__ptr + 2);
    uVar12 = 0;
    do {
      if (nVars < 0) {
LAB_00583282:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pcVar9 = *(char **)(lVar13 + uVar12 * 8);
      if (p->nCap < 1) {
        if (p->pArray == (int *)0x0) {
          piVar4 = (int *)malloc(4);
        }
        else {
          piVar4 = (int *)realloc(p->pArray,4);
        }
        p->pArray = piVar4;
        if (piVar4 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p->nCap = 1;
      }
      *p->pArray = (nVars + (int)uVar12) * 2 + 1;
      p->nSize = 1;
      if (0 < nVars) {
        lVar14 = 0;
        do {
          if (*pcVar9 != '-') {
            Vec_IntPush(p,(uint)(*pcVar9 == '0') + (int)lVar14);
          }
          lVar14 = lVar14 + 2;
          pcVar9 = pcVar9 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar14);
      }
      iVar3 = sat_solver_addclause(s,p->pArray,p->pArray + p->nSize);
      if (iVar3 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                      ,300,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8);
  }
  if ((int)uVar7 < 1) {
    bVar2 = false;
    uVar11 = 0;
  }
  else {
    lVar13 = *(long *)(__ptr + 2);
    uVar12 = 0;
    local_7c = 0;
    do {
      pcVar9 = *(char **)(lVar13 + uVar12 * 8);
      p->nSize = 0;
      if (0 < nCubes) {
        uVar15 = 0;
        iVar3 = nVars * 2;
        do {
          if (uVar12 != uVar15) {
            if (uVar8 <= uVar15) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (*(long *)(lVar13 + uVar15 * 8) != 0) {
              if ((long)((long)nVars + uVar15) < 0) goto LAB_00583282;
              Vec_IntPush(p,iVar3);
            }
          }
          uVar15 = uVar15 + 1;
          iVar3 = iVar3 + 2;
        } while ((uint)nCubes != uVar15);
      }
      if (0 < nVars) {
        lVar14 = 0;
        do {
          if (*pcVar9 != '-') {
            Vec_IntPush(p,(uint)(*pcVar9 == '1') + (int)lVar14);
          }
          lVar14 = lVar14 + 2;
          pcVar9 = pcVar9 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar14);
      }
      iVar3 = sat_solver_solve(s,p->pArray,p->pArray + p->nSize,0,0,0,0);
      if (iVar3 == -1) {
        *(undefined8 *)(lVar13 + uVar12 * 8) = 0;
        local_7c = local_7c + 1;
      }
      else if (iVar3 != 1) {
        uVar15 = uVar12;
        if (iVar3 != 0) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                        ,0x145,"int Bmc_CollapseIrredundantFull(Vec_Str_t *, int, int)");
        }
        break;
      }
      uVar12 = uVar12 + 1;
      uVar15 = uVar8;
    } while (uVar12 != uVar8);
    uVar11 = (uint)uVar15;
    bVar2 = 0 < local_7c;
  }
  if ((uVar11 == uVar7) && (bVar2)) {
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    else {
      lVar13 = *(long *)(__ptr + 2);
      uVar12 = 1;
      if (1 < (int)uVar6) {
        uVar12 = uVar6 & 0xffffffff;
      }
      uVar15 = 0;
      uVar6 = 0;
      do {
        lVar14 = *(long *)(lVar13 + uVar15 * 8);
        if (lVar14 != 0 && -3 < nVars) {
          iVar3 = (int)uVar6;
          uVar10 = 0;
          do {
            if ((iVar3 < 0) || (vSop->nSize <= iVar3 + (int)uVar10)) goto LAB_00583244;
            vSop->pArray[uVar10 + uVar6] = *(char *)(lVar14 + uVar10);
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
          uVar6 = (ulong)(uint)((int)uVar12 + iVar3);
        }
        uVar7 = (uint)uVar6;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar8);
    }
    if (((int)uVar7 < 0) || (vSop->nSize <= (int)uVar7)) {
LAB_00583244:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
    vSop->pArray[uVar7] = '\0';
    if (vSop->nSize <= (int)uVar7) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                    ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
    }
    vSop->nSize = uVar7 + 1;
  }
  sat_solver_delete(s);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return 0;
}

Assistant:

int Bmc_CollapseIrredundantFull( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars+nCubes);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars + nCubes );
    // add cubes
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(nVars + i, 1) ); // neg literal
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '0') );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through cubes in the direct order
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && Vec_PtrEntry(vCubes, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(nVars + k, 0) ); // pos literal
        // collect cube
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == Vec_PtrSize(vCubes) && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}